

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ReshapeStaticLayerParams::InternalSwap
          (ReshapeStaticLayerParams *this,ReshapeStaticLayerParams *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->targetshape_).current_size_;
  iVar6 = (this->targetshape_).total_size_;
  pvVar2 = (this->targetshape_).arena_or_elements_;
  iVar4 = (other->targetshape_).total_size_;
  pvVar3 = (other->targetshape_).arena_or_elements_;
  (this->targetshape_).current_size_ = (other->targetshape_).current_size_;
  (this->targetshape_).total_size_ = iVar4;
  (this->targetshape_).arena_or_elements_ = pvVar3;
  (other->targetshape_).current_size_ = iVar5;
  (other->targetshape_).total_size_ = iVar6;
  (other->targetshape_).arena_or_elements_ = pvVar2;
  return;
}

Assistant:

void ReshapeStaticLayerParams::InternalSwap(ReshapeStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  targetshape_.InternalSwap(&other->targetshape_);
}